

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

ostream * operator<<(ostream *os,NodeUID *uid)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,uid->nid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uid->rid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uid->tid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return poVar1;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const cpprofiler::NodeUID& uid) {
	return os << "{" << uid.nid << ", " << uid.rid << ", " << uid.tid << "}";
}